

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t driver::zetMetricQueryDestroy(zet_metric_query_handle_t hMetricQuery)

{
  zet_pfnMetricQueryDestroy_t pfnDestroy;
  ze_result_t result;
  zet_metric_query_handle_t hMetricQuery_local;
  
  pfnDestroy._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c918 != (code *)0x0) {
    pfnDestroy._4_4_ = (*DAT_0011c918)(hMetricQuery);
  }
  return pfnDestroy._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricQueryDestroy(
        zet_metric_query_handle_t hMetricQuery          ///< [in][release] handle of metric query
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDestroy = context.zetDdiTable.MetricQuery.pfnDestroy;
        if( nullptr != pfnDestroy )
        {
            result = pfnDestroy( hMetricQuery );
        }
        else
        {
            // generic implementation

        }

        return result;
    }